

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.h
# Opt level: O2

bool __thiscall ElfSegment::isSectionPartOf(ElfSegment *this,ElfSection *section)

{
  Elf32_Off EVar1;
  Elf32_Off EVar2;
  bool bVar3;
  Elf32_Word EVar4;
  Elf32_Off EVar5;
  
  EVar1 = (section->header).sh_offset;
  EVar4 = 0;
  if ((section->header).sh_type != 8) {
    EVar4 = (section->header).sh_size;
  }
  EVar2 = (this->header).p_offset;
  EVar5 = (this->header).p_filesz + EVar2;
  if ((int)EVar5 < (int)EVar1 || (int)EVar1 < (int)EVar2) {
    bVar3 = false;
  }
  else {
    if (EVar1 == EVar5) {
      return EVar4 == 0;
    }
    bVar3 = true;
    if ((int)EVar5 < (int)(EVar4 + EVar1)) {
      Logger::printError<>(Error,"Section partially contained in segment");
      return false;
    }
  }
  return bVar3;
}

Assistant:

Elf32_Word getAlignment() { return header.sh_addralign; }